

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_3::Header::insert(Header *this,char *name,Attribute *attribute)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  float *pfVar6;
  mapped_type pAVar7;
  mapped_type *ppAVar8;
  pointer ppVar9;
  undefined4 extraout_var;
  ostream *poVar10;
  undefined4 extraout_var_00;
  Attribute *pAVar11;
  long *in_RDX;
  char *in_RSI;
  Attribute *tmp_1;
  stringstream _iex_throw_s_1;
  Attribute *tmp;
  TypedAttribute<float> *dwaattr;
  iterator i;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffff9f8;
  Name *in_stack_fffffffffffffa00;
  key_type *in_stack_fffffffffffffa38;
  map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
  *in_stack_fffffffffffffa40;
  stringstream local_558 [16];
  ostream local_548 [632];
  mapped_type local_2d0;
  _Self local_2c8;
  TypedAttribute<float> *local_2c0;
  _Self local_1b8 [3];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long *local_18;
  char *local_10;
  
  if (*in_RSI == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Image attribute name cannot be an empty string.");
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  Imf_3_3::Name::Name(in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
  local_1b8[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
       ::find((map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
               *)in_stack_fffffffffffff9f8,(key_type *)0xa22c27);
  iVar3 = strcmp(local_10,"dwaCompressionLevel");
  if (iVar3 == 0) {
    pcVar5 = (char *)(**(code **)(*local_18 + 0x10))();
    iVar3 = strcmp(pcVar5,"float");
    if (iVar3 == 0) {
      local_2c0 = (TypedAttribute<float> *)
                  __dynamic_cast(local_18,&Attribute::typeinfo,&TypedAttribute<float>::typeinfo,0);
      if (local_2c0 == (TypedAttribute<float> *)0x0) {
        __cxa_bad_cast();
      }
      pfVar6 = TypedAttribute<float>::value(local_2c0);
      fVar1 = *pfVar6;
      pfVar6 = dwaCompressionLevel((Header *)0xa22cd7);
      *pfVar6 = fVar1;
    }
  }
  local_2c8._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
       ::end((map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
              *)in_stack_fffffffffffff9f8);
  bVar2 = std::operator==(local_1b8,&local_2c8);
  if (bVar2) {
    pAVar7 = (mapped_type)(**(code **)(*local_18 + 0x18))();
    local_2d0 = pAVar7;
    Imf_3_3::Name::Name(in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
    ppAVar8 = std::
              map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
              ::operator[](in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    *ppAVar8 = pAVar7;
  }
  else {
    ppVar9 = std::_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_> *)
                        0xa22e0d);
    iVar3 = (*ppVar9->second->_vptr_Attribute[2])();
    pcVar5 = (char *)(**(code **)(*local_18 + 0x10))();
    iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),pcVar5);
    if (iVar3 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_558);
      poVar10 = std::operator<<(local_548,"Cannot assign a value of type \"");
      pcVar5 = (char *)(**(code **)(*local_18 + 0x10))();
      poVar10 = std::operator<<(poVar10,pcVar5);
      poVar10 = std::operator<<(poVar10,"\" to image attribute \"");
      poVar10 = std::operator<<(poVar10,local_10);
      poVar10 = std::operator<<(poVar10,"\" of type \"");
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>
                           *)0xa22ef6);
      iVar3 = (*ppVar9->second->_vptr_Attribute[2])();
      poVar10 = std::operator<<(poVar10,(char *)CONCAT44(extraout_var_00,iVar3));
      std::operator<<(poVar10,"\".");
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::TypeExc::TypeExc((TypeExc *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      __cxa_throw(uVar4,&Iex_3_3::TypeExc::typeinfo,Iex_3_3::TypeExc::~TypeExc);
    }
    pAVar11 = (Attribute *)(**(code **)(*local_18 + 0x18))();
    ppVar9 = std::_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_> *)
                        0xa22fdd);
    if (ppVar9->second != (Attribute *)0x0) {
      (*ppVar9->second->_vptr_Attribute[1])();
    }
    ppVar9 = std::_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_> *)
                        0xa23014);
    ppVar9->second = pAVar11;
  }
  return;
}

Assistant:

void
Header::insert (const char name[], const Attribute& attribute)
{
    if (name[0] == 0)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Image attribute name cannot be an empty string.");

    AttributeMap::iterator i = _map.find (name);
    if (!strcmp (name, "dwaCompressionLevel") &&
        !strcmp (attribute.typeName (), "float"))
    {
        const TypedAttribute<float>& dwaattr =
            dynamic_cast<const TypedAttribute<float>&> (attribute);
        dwaCompressionLevel () = dwaattr.value ();
    }

    if (i == _map.end ())
    {
        Attribute* tmp = attribute.copy ();

        try
        {
            _map[name] = tmp;
        }
        catch (...)
        {
            delete tmp;
            throw;
        }
    }
    else
    {
        if (strcmp (i->second->typeName (), attribute.typeName ()))
            THROW (
                IEX_NAMESPACE::TypeExc,
                "Cannot assign a value of "
                "type \""
                    << attribute.typeName ()
                    << "\" "
                       "to image attribute \""
                    << name
                    << "\" of "
                       "type \""
                    << i->second->typeName () << "\".");

        Attribute* tmp = attribute.copy ();
        delete i->second;
        i->second = tmp;
    }
}